

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<long_double>::TPZSkylMatrix(TPZSkylMatrix<long_double> *this,int64_t dim)

{
  longdouble *local_20;
  
  TPZMatrix<long_double>::TPZMatrix(&this->super_TPZMatrix<long_double>,&PTR_PTR_01688e18,dim,dim);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSkylMatrix_01688b90;
  TPZVec<long_double_*>::TPZVec(&this->fElem,dim + 1);
  TPZVec<long_double>::TPZVec(&this->fStorage,0);
  local_20 = (longdouble *)0x0;
  TPZVec<long_double_*>::Fill(&this->fElem,&local_20,0,-1);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}